

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTAC.cpp
# Opt level: O1

void __thiscall MiniScript::Context::StoreValue(Context *this,Value *lhs,Value *value)

{
  long *plVar1;
  RefCountedStorage *pRVar2;
  uint uVar3;
  StringStorage *pSVar4;
  char *pcVar5;
  int iVar6;
  Context *context;
  Value index;
  Value seq;
  RuntimeException local_c8;
  Value local_98;
  Value local_88;
  Value local_78;
  Value local_68;
  Value local_58;
  Value local_48;
  StringStorage *local_38;
  anon_union_8_3_2f476f46_for_data local_30;
  
  switch(lhs->type) {
  case Null:
    break;
  default:
    pSVar4 = (StringStorage *)operator_new(0x30);
    iVar6 = (int)lhs;
    (pSVar4->super_RefCountedStorage).refCount = 1;
    (pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar4->dataSize = 0xe;
    pSVar4->charCount = -1;
    pcVar5 = (char *)operator_new__(0xe);
    pSVar4->data = pcVar5;
    builtin_strncpy(pcVar5 + 6," lvalue",8);
    plVar1 = &(pSVar4->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + 1;
    builtin_strncpy(pcVar5,"not an l",8);
    local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1358;
    local_c8.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
    local_c8.super_MiniscriptException.location.context.isTemp = false;
    local_c8.super_MiniscriptException.location.lineNum = 0;
    local_c8.super_MiniscriptException.message.isTemp = false;
    local_c8.super_MiniscriptException.message.ss = pSVar4;
    if ((pSVar4->super_RefCountedStorage).refCount == 0) {
      (*(pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar4);
    }
    local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1308;
    RuntimeException::raise(&local_c8,iVar6);
    local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1358;
    if ((local_c8.super_MiniscriptException.message.ss != (StringStorage *)0x0) &&
       (local_c8.super_MiniscriptException.message.isTemp == false)) {
      plVar1 = &((local_c8.super_MiniscriptException.message.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_c8.super_MiniscriptException.message.ss)->super_RefCountedStorage).
          _vptr_RefCountedStorage[1])();
      }
      local_c8.super_MiniscriptException.message.ss = (StringStorage *)0x0;
    }
    if ((local_c8.super_MiniscriptException.location.context.ss != (StringStorage *)0x0) &&
       (local_c8.super_MiniscriptException.location.context.isTemp == false)) {
      plVar1 = (long *)((long)local_c8.super_MiniscriptException.location.context.ss + 8);
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_c8.super_MiniscriptException.location.context.ss)->super_RefCountedStorage).
          _vptr_RefCountedStorage[1])();
      }
      local_c8.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
    }
    std::exception::~exception((exception *)&local_c8);
    plVar1 = &(pSVar4->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar4);
    }
    break;
  case Temp:
    iVar6 = (lhs->data).tempNum;
    local_68.type = value->type;
    local_68.noInvoke = value->noInvoke;
    local_68.localOnly = value->localOnly;
    local_68.data = (anon_union_8_3_2f476f46_for_data)(value->data).ref;
    if ((Temp < local_68.type) && (local_68.data.ref != (RefCountedStorage *)0x0)) {
      (local_68.data.ref)->refCount = (local_68.data.ref)->refCount + 1;
    }
    SetTemp(this,iVar6,&local_68);
    if ((Temp < local_68.type) && (local_68.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_68.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_68.data.ref)->_vptr_RefCountedStorage[1])();
      }
    }
    break;
  case Var:
    Value::GetString((Value *)&local_38);
    local_78.type = value->type;
    local_78.noInvoke = value->noInvoke;
    local_78.localOnly = value->localOnly;
    local_78.data = (anon_union_8_3_2f476f46_for_data)(value->data).ref;
    if ((Temp < local_78.type) && (local_78.data.ref != (RefCountedStorage *)0x0)) {
      (local_78.data.ref)->refCount = (local_78.data.ref)->refCount + 1;
    }
    SetVar(this,(String *)&local_38,&local_78);
    if ((Temp < local_78.type) && (local_78.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_78.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_78.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_78.data.number = 0.0;
    }
    if ((local_38 != (StringStorage *)0x0) && (local_30.tempNum._0_1_ == '\0')) {
      plVar1 = &(local_38->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_38->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
    }
    break;
  case SeqElem:
    pRVar2 = (lhs->data).ref;
    context = (Context *)(pRVar2 + 1);
    Value::Val(&local_48,context,(ValueDict *)this);
    iVar6 = (int)context;
    if ((bool)local_48.type == false) {
      pSVar4 = (StringStorage *)operator_new(0x30);
      (pSVar4->super_RefCountedStorage).refCount = 1;
      (pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage =
           (_func_int **)&PTR__StringStorage_001d10b0;
      pSVar4->dataSize = 0x22;
      pSVar4->charCount = -1;
      pcVar5 = (char *)operator_new__(0x22);
      pSVar4->data = pcVar5;
      builtin_strncpy(pcVar5 + 0x10,"d element of nul",0x10);
      plVar1 = &(pSVar4->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
      builtin_strncpy(pcVar5,"can\'t set indexe",0x10);
      pcVar5[0x20] = 'l';
      pcVar5[0x21] = '\0';
      local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1358;
      local_c8.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      local_c8.super_MiniscriptException.location.context.isTemp = false;
      local_c8.super_MiniscriptException.location.lineNum = 0;
      local_c8.super_MiniscriptException.message.isTemp = false;
      local_c8.super_MiniscriptException.message.ss = pSVar4;
      if ((pSVar4->super_RefCountedStorage).refCount == 0) {
        (*(pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar4);
      }
      local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1308;
      RuntimeException::raise(&local_c8,iVar6);
      local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1358;
      if ((local_c8.super_MiniscriptException.message.ss != (StringStorage *)0x0) &&
         (local_c8.super_MiniscriptException.message.isTemp == false)) {
        plVar1 = &((local_c8.super_MiniscriptException.message.ss)->super_RefCountedStorage).
                  refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_c8.super_MiniscriptException.message.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_c8.super_MiniscriptException.message.ss = (StringStorage *)0x0;
      }
      if ((local_c8.super_MiniscriptException.location.context.ss != (StringStorage *)0x0) &&
         (local_c8.super_MiniscriptException.location.context.isTemp == false)) {
        plVar1 = (long *)((long)local_c8.super_MiniscriptException.location.context.ss + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_c8.super_MiniscriptException.location.context.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_c8.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      }
      std::exception::~exception((exception *)&local_c8);
      plVar1 = &(pSVar4->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar4);
      }
    }
    if ((local_48.type & ~Number) != List) {
      pSVar4 = (StringStorage *)operator_new(0x30);
      (pSVar4->super_RefCountedStorage).refCount = 1;
      (pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage =
           (_func_int **)&PTR__StringStorage_001d10b0;
      pSVar4->dataSize = 0x2a;
      pSVar4->charCount = -1;
      pcVar5 = (char *)operator_new__(0x2a);
      pSVar4->data = pcVar5;
      builtin_strncpy(pcVar5 + 0x10,"exed element in this type",0x1a);
      plVar1 = &(pSVar4->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
      builtin_strncpy(pcVar5,"can\'t set an ind",0x10);
      local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1358;
      local_c8.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      local_c8.super_MiniscriptException.location.context.isTemp = false;
      local_c8.super_MiniscriptException.location.lineNum = 0;
      local_c8.super_MiniscriptException.message.isTemp = false;
      local_c8.super_MiniscriptException.message.ss = pSVar4;
      if ((pSVar4->super_RefCountedStorage).refCount == 0) {
        (*(pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar4);
      }
      local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1308;
      RuntimeException::raise(&local_c8,iVar6);
      local_c8.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001d1358;
      if ((local_c8.super_MiniscriptException.message.ss != (StringStorage *)0x0) &&
         (local_c8.super_MiniscriptException.message.isTemp == false)) {
        plVar1 = &((local_c8.super_MiniscriptException.message.ss)->super_RefCountedStorage).
                  refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_c8.super_MiniscriptException.message.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_c8.super_MiniscriptException.message.ss = (StringStorage *)0x0;
      }
      if ((local_c8.super_MiniscriptException.location.context.ss != (StringStorage *)0x0) &&
         (local_c8.super_MiniscriptException.location.context.isTemp == false)) {
        plVar1 = (long *)((long)local_c8.super_MiniscriptException.location.context.ss + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_c8.super_MiniscriptException.location.context.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_c8.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      }
      std::exception::~exception((exception *)&local_c8);
      plVar1 = &(pSVar4->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(pSVar4->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar4);
      }
    }
    local_98.type = *(ValueType *)&pRVar2[2]._vptr_RefCountedStorage;
    local_98._1_2_ = *(undefined2 *)((long)&pRVar2[2]._vptr_RefCountedStorage + 1);
    local_98.data = (anon_union_8_3_2f476f46_for_data)pRVar2[2].refCount;
    uVar3 = (uint)local_98.type;
    if ((2 < uVar3) &&
       ((ListStorage<MiniScript::Value> *)local_98.data.ref != (ListStorage<MiniScript::Value> *)0x0
       )) {
      (local_98.data.ref)->refCount = (local_98.data.ref)->refCount + 1;
    }
    if ((uVar3 < 9) && ((0x184U >> (uVar3 & 0x1f) & 1) != 0)) {
      Value::Val((Value *)&local_c8,(Context *)&local_98,(ValueDict *)this);
      Value::operator=(&local_98,(Value *)&local_c8);
      if ((2 < (byte)local_c8.super_MiniscriptException.super_exception) &&
         (local_c8.super_MiniscriptException.location.context.ss != (StringStorage *)0x0)) {
        plVar1 = (long *)((long)local_c8.super_MiniscriptException.location.context.ss + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_c8.super_MiniscriptException.location.context.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_c8.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      }
    }
    local_58.type = local_98.type;
    local_58.noInvoke = local_98.noInvoke;
    local_58.localOnly = local_98.localOnly;
    local_58.data.number = local_98.data.number;
    if ((Temp < local_98.type) &&
       ((ListStorage<MiniScript::Value> *)local_98.data.ref != (ListStorage<MiniScript::Value> *)0x0
       )) {
      (local_98.data.ref)->refCount = (local_98.data.ref)->refCount + 1;
    }
    local_88.type = value->type;
    local_88.noInvoke = value->noInvoke;
    local_88.localOnly = value->localOnly;
    local_88.data = (anon_union_8_3_2f476f46_for_data)(value->data).ref;
    if ((Temp < local_88.type) && (local_88.data.ref != (RefCountedStorage *)0x0)) {
      (local_88.data.ref)->refCount = (local_88.data.ref)->refCount + 1;
    }
    Value::SetElem(&local_48,&local_58,&local_88);
    if ((Temp < local_88.type) && (local_88.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_88.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_88.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_88.data.number = 0.0;
    }
    if ((2 < local_58.type) &&
       ((ListStorage<MiniScript::Value> *)local_58.data.ref != (ListStorage<MiniScript::Value> *)0x0
       )) {
      plVar1 = &(local_58.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_58.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_58.data.number = 0.0;
    }
    if ((Temp < local_98.type) &&
       ((ListStorage<MiniScript::Value> *)local_98.data.ref != (ListStorage<MiniScript::Value> *)0x0
       )) {
      plVar1 = &(local_98.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_98.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_98.data.number = 0.0;
    }
    if ((Temp < local_48.type) && (local_48.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_48.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_48.data.ref)->_vptr_RefCountedStorage[1])();
      }
    }
  }
  return;
}

Assistant:

void Context::StoreValue(Value lhs, Value value) {
//		std::cout << "Storing into " << lhs.ToString().c_str() << ": " << value.ToString().c_str() << std::endl;
		if (lhs.type == ValueType::Temp) {
			SetTemp(lhs.data.tempNum, value);
		} else if (lhs.type == ValueType::Var) {
			SetVar(lhs.GetString(), value);
		} else if (lhs.type == ValueType::SeqElem) {
			SeqElemStorage *seqElem = (SeqElemStorage*)(lhs.data.ref);
			Value seq = seqElem->sequence.Val(this);
			if (seq.IsNull()) RuntimeException("can't set indexed element of null").raise();
			if (not seq.CanSetElem()) RuntimeException("can't set an indexed element in this type").raise();
			Value index = seqElem->index;
			if (index.type == ValueType::Var or index.type == ValueType::SeqElem or
				index.type == ValueType::Temp) index = index.Val(this);
			seq.SetElem(index, value);
		} else {
			if (!lhs.IsNull()) RuntimeException("not an lvalue").raise();
		}
	}